

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseMeshChunk(Discreet3DSImporter *this)

{
  pointer *ppaVar1;
  vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_> *this_00;
  pointer *ppFVar2;
  StreamReader<false,_false> *this_01;
  pointer pMVar3;
  iterator iVar4;
  iterator __position;
  pointer pFVar5;
  ushort uVar6;
  uint uVar7;
  float fVar8;
  Chunk chunk;
  Face local_58;
  uint local_3c;
  Chunk local_36;
  
  uVar7 = *(int *)&this->stream->limit - *(int *)&this->stream->current;
  do {
    while( true ) {
      if (uVar7 < 6) {
        return;
      }
      ReadChunk(this,&local_36);
      if (0 < (int)(local_36.Size - 6)) break;
      uVar7 = (int)this->stream->limit - (int)this->stream->current;
    }
    this_01 = this->stream;
    local_3c = StreamReader<false,_false>::SetReadLimit
                         (this_01,(local_36.Size - 6) +
                                  (*(int *)&this_01->current - *(int *)&this_01->buffer));
    uVar7 = (uint)local_36.Flag << 0x1c | local_36.Flag - 0x4110 >> 4;
    if (uVar7 < 6) {
      pMVar3 = (this->mScene->mMeshes).
               super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
               super__Vector_impl_data._M_finish;
      switch(uVar7) {
      case 0:
        uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(pMVar3 + -1),
                   (ulong)uVar6);
        if (uVar6 != 0) {
          uVar7 = uVar6 + 1;
          do {
            local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0;
            local_58.super_FaceWithSmoothingGroup.mIndices[1] = 0;
            local_58.super_FaceWithSmoothingGroup._8_8_ =
                 local_58.super_FaceWithSmoothingGroup._8_8_ & 0xffffffff00000000;
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            local_58.super_FaceWithSmoothingGroup.mIndices[0] = (uint32_t)fVar8;
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            local_58.super_FaceWithSmoothingGroup.mIndices[1] = (uint32_t)fVar8;
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            local_58.super_FaceWithSmoothingGroup.mIndices[2] = (uint32_t)fVar8;
            iVar4._M_current =
                 pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mPositions.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
              _M_realloc_insert<aiVector3t<float>const&>
                        ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                         (pMVar3 + -1),iVar4,(aiVector3t<float> *)&local_58);
            }
            else {
              (iVar4._M_current)->z = fVar8;
              (iVar4._M_current)->x = (float)local_58.super_FaceWithSmoothingGroup.mIndices[0];
              (iVar4._M_current)->y = (float)local_58.super_FaceWithSmoothingGroup.mIndices[1];
              ppaVar1 = &pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mPositions.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        break;
      case 1:
        uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
        this_00 = &pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces;
        std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::reserve
                  (this_00,(ulong)uVar6);
        if (uVar6 != 0) {
          uVar7 = uVar6 + 1;
          do {
            local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0xffffffff;
            local_58.super_FaceWithSmoothingGroup.mIndices[1] = 0xffffffff;
            local_58.super_FaceWithSmoothingGroup.mIndices[2] = 0xffffffff;
            local_58.super_FaceWithSmoothingGroup.iSmoothGroup = 0;
            __position._M_current =
                 pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                 super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::
              _M_realloc_insert<Assimp::D3DS::Face>(this_00,__position,&local_58);
            }
            else {
              ((__position._M_current)->super_FaceWithSmoothingGroup).mIndices[0] = 0xffffffff;
              ((__position._M_current)->super_FaceWithSmoothingGroup).mIndices[1] = 0xffffffff;
              *(undefined8 *)(((__position._M_current)->super_FaceWithSmoothingGroup).mIndices + 2)
                   = 0xffffffff;
              ppFVar2 = &pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppFVar2 = *ppFVar2 + 1;
            }
            pFVar5 = pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                     super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
            pFVar5[-1].super_FaceWithSmoothingGroup.mIndices[0] = (uint)uVar6;
            uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
            pFVar5[-1].super_FaceWithSmoothingGroup.mIndices[1] = (uint)uVar6;
            uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
            pFVar5[-1].super_FaceWithSmoothingGroup.mIndices[2] = (uint)uVar6;
            StreamReader<false,_false>::IncPtr(this->stream,2);
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0xcdcdcdcd;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&pMVar3[-1].mFaceMaterials,
                   (long)pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pMVar3[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,
                   (value_type_conflict2 *)&local_58);
        if (6 < *(int *)&this->stream->limit - *(int *)&this->stream->current) {
          ParseFaceChunk(this);
        }
        break;
      case 3:
        uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  (&pMVar3[-1].mTexCoords,(ulong)uVar6);
        if (uVar6 != 0) {
          uVar7 = uVar6 + 1;
          do {
            local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0;
            local_58.super_FaceWithSmoothingGroup.mIndices[1] = 0;
            local_58.super_FaceWithSmoothingGroup._8_8_ =
                 local_58.super_FaceWithSmoothingGroup._8_8_ & 0xffffffff00000000;
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            local_58.super_FaceWithSmoothingGroup.mIndices[0] = (uint32_t)fVar8;
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            local_58.super_FaceWithSmoothingGroup.mIndices[1] = (uint32_t)fVar8;
            iVar4._M_current =
                 pMVar3[-1].mTexCoords.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                pMVar3[-1].mTexCoords.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
              _M_realloc_insert<aiVector3t<float>const&>
                        ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                         &pMVar3[-1].mTexCoords,iVar4,(aiVector3t<float> *)&local_58);
            }
            else {
              (iVar4._M_current)->z = (float)local_58.super_FaceWithSmoothingGroup.mIndices[2];
              (iVar4._M_current)->x = (float)local_58.super_FaceWithSmoothingGroup.mIndices[0];
              (iVar4._M_current)->y = fVar8;
              ppaVar1 = &pMVar3[-1].mTexCoords.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        break;
      case 5:
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.a1 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.b1 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.c1 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.a2 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.b2 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.c2 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.a3 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.b3 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.c3 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.a4 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.b4 = fVar8;
        fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar3[-1].mMat.c4 = fVar8;
      }
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,local_3c);
    uVar7 = (int)this->stream->limit - (int)this->stream->current;
  } while (uVar7 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseMeshChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // Get the mesh we're currently working on
    D3DS::Mesh& mMesh = mScene->mMeshes.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_VERTLIST:
        {
        // This is the list of all vertices in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mPositions.reserve(num);
        while (num-- > 0)   {
            aiVector3D v;
            v.x = stream->GetF4();
            v.y = stream->GetF4();
            v.z = stream->GetF4();
            mMesh.mPositions.push_back(v);
        }}
        break;
    case Discreet3DS::CHUNK_TRMATRIX:
        {
        // This is the RLEATIVE transformation matrix of the current mesh. Vertices are
        // pretransformed by this matrix wonder.
        mMesh.mMat.a1 = stream->GetF4();
        mMesh.mMat.b1 = stream->GetF4();
        mMesh.mMat.c1 = stream->GetF4();
        mMesh.mMat.a2 = stream->GetF4();
        mMesh.mMat.b2 = stream->GetF4();
        mMesh.mMat.c2 = stream->GetF4();
        mMesh.mMat.a3 = stream->GetF4();
        mMesh.mMat.b3 = stream->GetF4();
        mMesh.mMat.c3 = stream->GetF4();
        mMesh.mMat.a4 = stream->GetF4();
        mMesh.mMat.b4 = stream->GetF4();
        mMesh.mMat.c4 = stream->GetF4();
        }
        break;

    case Discreet3DS::CHUNK_MAPLIST:
        {
        // This is the list of all UV coords in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mTexCoords.reserve(num);
        while (num-- > 0)   {
            aiVector3D v;
            v.x = stream->GetF4();
            v.y = stream->GetF4();
            mMesh.mTexCoords.push_back(v);
        }}
        break;

    case Discreet3DS::CHUNK_FACELIST:
        {
        // This is the list of all faces in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mFaces.reserve(num);
        while (num-- > 0)   {
            // 3DS faces are ALWAYS triangles
            mMesh.mFaces.push_back(D3DS::Face());
            D3DS::Face& sFace = mMesh.mFaces.back();

            sFace.mIndices[0] = (uint16_t)stream->GetI2();
            sFace.mIndices[1] = (uint16_t)stream->GetI2();
            sFace.mIndices[2] = (uint16_t)stream->GetI2();

            stream->IncPtr(2); // skip edge visibility flag
        }

        // Resize the material array (0xcdcdcdcd marks the default material; so if a face is
        // not referenced by a material, $$DEFAULT will be assigned to it)
        mMesh.mFaceMaterials.resize(mMesh.mFaces.size(),0xcdcdcdcd);

        // Larger 3DS files could have multiple FACE chunks here
        chunkSize = stream->GetRemainingSizeToLimit();
        if ( chunkSize > (int) sizeof(Discreet3DS::Chunk ) )
            ParseFaceChunk();
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}